

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anmparse.c
# Opt level: O0

int yypcontext_expected_tokens(yypcontext_t *yyctx,yysymbol_kind_t *yyarg,int yyargn)

{
  int iVar1;
  yysymbol_kind_t local_44;
  yysymbol_kind_t local_40;
  yysymbol_kind_t local_3c;
  int yyx;
  int yyxend;
  int yychecklim;
  int yyxbegin;
  int yyn;
  int yycount;
  int yyargn_local;
  yysymbol_kind_t *yyarg_local;
  yypcontext_t *yyctx_local;
  
  yyxbegin = 0;
  iVar1 = (int)yypact[(int)(uint)*yyctx->yyssp];
  if (iVar1 != -0x21) {
    if (iVar1 < 0) {
      local_40 = -iVar1;
    }
    else {
      local_40 = YYSYMBOL_YYEOF;
    }
    local_44 = 0xbb - iVar1;
    if (YYSYMBOL_ILLEGAL_TOKEN < local_44) {
      local_44 = YYSYMBOL_YYACCEPT;
    }
    for (local_3c = local_40; local_3c < local_44; local_3c = local_3c + YYSYMBOL_YYerror) {
      if (((uint)"\x16!\n\x10\x17\x18\x19\x1a\x1b\x05\x17\x18\x19\x1a\x1b\x17\x18\x19\x1a\x1b\b\x10\n\x03\x04\x05\x06"
                 [local_3c + iVar1] == local_3c) && (local_3c != YYSYMBOL_YYerror)) {
        if (yyarg != (yysymbol_kind_t *)0x0) {
          if (yyxbegin == yyargn) {
            return 0;
          }
          yyarg[yyxbegin] = local_3c;
        }
        yyxbegin = yyxbegin + 1;
      }
    }
  }
  if (((yyarg != (yysymbol_kind_t *)0x0) && (yyxbegin == 0)) && (0 < yyargn)) {
    *yyarg = YYSYMBOL_YYEMPTY;
  }
  return yyxbegin;
}

Assistant:

static int
yypcontext_expected_tokens (const yypcontext_t *yyctx,
                            yysymbol_kind_t yyarg[], int yyargn)
{
  /* Actual size of YYARG. */
  int yycount = 0;
  int yyn = yypact[+*yyctx->yyssp];
  if (!yypact_value_is_default (yyn))
    {
      /* Start YYX at -YYN if negative to avoid negative indexes in
         YYCHECK.  In other words, skip the first -YYN actions for
         this state because they are default actions.  */
      int yyxbegin = yyn < 0 ? -yyn : 0;
      /* Stay within bounds of both yycheck and yytname.  */
      int yychecklim = YYLAST - yyn + 1;
      int yyxend = yychecklim < YYNTOKENS ? yychecklim : YYNTOKENS;
      int yyx;
      for (yyx = yyxbegin; yyx < yyxend; ++yyx)
        if (yycheck[yyx + yyn] == yyx && yyx != YYSYMBOL_YYerror
            && !yytable_value_is_error (yytable[yyx + yyn]))
          {
            if (!yyarg)
              ++yycount;
            else if (yycount == yyargn)
              return 0;
            else
              yyarg[yycount++] = YY_CAST (yysymbol_kind_t, yyx);
          }
    }
  if (yyarg && yycount == 0 && 0 < yyargn)
    yyarg[0] = YYSYMBOL_YYEMPTY;
  return yycount;
}